

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O1

void re2c::prtChOrHex(ostream *o,uint32_t c)

{
  opt_t *poVar1;
  char local_1a [2];
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (((poVar1->encoding).type_ != EBCDIC) && (((c - 0x20 < 0x5f || (c - 9 < 5)) || (c == 0x20)))) {
    local_1a[0] = '\'';
    std::__ostream_insert<char,std::char_traits<char>>(o,local_1a,1);
    prtCh(o,c);
    local_1a[1] = 0x27;
    std::__ostream_insert<char,std::char_traits<char>>(o,local_1a + 1,1);
    return;
  }
  prtHex(o,c);
  return;
}

Assistant:

void prtChOrHex(std::ostream& o, uint32_t c)
{
	if (opts->encoding.type () != Enc::EBCDIC
		&& (is_print (c) || is_space (c)))
	{
		o << '\'';
		prtCh(o, c);
		o << '\'';
	}
	else
	{
		prtHex(o, c);
	}
}